

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_2ca42e::ValueSetter::writeAppearance(ValueSetter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 *puVar8;
  undefined1 trim_trailing_zeroes;
  ulong uVar10;
  ulong *puVar11;
  long *plVar12;
  void *__buf;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  type ii_1;
  int iVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  type ii;
  uint uVar19;
  ulong i;
  long lVar20;
  uint uVar21;
  size_type *psVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  long *local_1f0;
  void *local_1e8;
  long local_1e0;
  long lStack_1d8;
  double local_1d0;
  ulong local_1c8;
  string local_1c0;
  ValueSetter *local_1a0;
  string local_198;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  double local_138;
  ulong uStack_130;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  double local_108;
  double dStack_100;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  pointer pbVar9;
  
  this->replaced = true;
  local_138 = this->tf * 1.2;
  uStack_130 = 0;
  dVar23 = ((this->bbox).ury - (this->bbox).lly) / local_138;
  uVar6 = (ulong)dVar23;
  uVar6 = (long)(dVar23 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar2 = (this->opt).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (this->opt).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar15 = uVar6 < 2 || pbVar2 == pbVar9;
  local_1a0 = this;
  if (uVar6 >= 2 && pbVar2 != pbVar9) {
    local_1d0 = (double)CONCAT71(local_1d0._1_7_,bVar15);
    uVar10 = (long)pbVar9 - (long)pbVar2 >> 5;
    __s2 = (this->V)._M_dataplus._M_p;
    __n = (this->V)._M_string_length;
    uVar14 = uVar10 + (uVar10 == 0);
    psVar22 = &pbVar2->_M_string_length;
    i = 0;
    local_1c8 = uVar10;
    local_108 = (double)uVar6;
LAB_0016dab4:
    if ((*psVar22 != __n) ||
       ((__n != 0 &&
        (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (psVar22 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 != 0))))
    goto LAB_0016dad9;
    if (i >> 0x1f != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    }
    dVar23 = local_108;
    uVar10 = local_1c8;
    if ((uVar6 + i & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar6 + i);
    }
    iVar3 = (int)i;
    uVar19 = iVar3 - 1;
    iVar16 = 1;
    if (iVar3 < 1) {
      iVar16 = iVar3;
    }
    uVar21 = SUB84(dVar23,0);
    uVar6 = (ulong)(uVar21 - iVar16);
    iVar16 = ((uVar21 - iVar16) - 1) + iVar3;
    if (iVar3 < 1) {
      uVar19 = 0;
    }
    iVar13 = (int)uVar10;
    if (uVar10 < 0x80000000) {
      if (iVar13 <= iVar16) goto LAB_0016dbe2;
    }
    else {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar10);
      if (iVar13 <= iVar16) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar10);
LAB_0016dbe2:
        uVar6 = 1;
        if (iVar3 < 1) {
          uVar6 = i & 0xffffffff;
        }
        iVar4 = 1;
        if (1 < iVar3) {
          iVar4 = iVar3;
        }
        uVar5 = (iVar4 + iVar13 + ~uVar21 + (int)uVar6) - iVar3;
        uVar19 = 0;
        if (0 < (int)uVar5) {
          uVar19 = uVar5;
        }
        iVar16 = iVar16 - (((uVar21 - (int)uVar6) - iVar13) + iVar3);
      }
    }
    uVar10 = (ulong)uVar19;
    lVar20 = uVar10 << 5;
    local_1c8 = uVar10;
    while( true ) {
      if (iVar16 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar16);
      }
      trim_trailing_zeroes = (undefined1)uVar6;
      if ((ulong)(long)iVar16 < uVar10) break;
      pbVar2 = (local_1a0->opt).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_1a0->opt).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_158,(value_type *)((long)&(pbVar2->_M_dataplus)._M_p + lVar20));
      uVar10 = uVar10 + 1;
      lVar20 = lVar20 + 0x20;
    }
    lVar20 = (i - local_1c8) + 1;
    auVar24._8_4_ = (int)((ulong)lVar20 >> 0x20);
    auVar24._0_8_ = lVar20;
    auVar24._12_4_ = 0x45300000;
    dStack_100 = auVar24._8_8_ - 1.9342813113834067e+25;
    local_108 = dStack_100 + ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
    this = local_1a0;
    goto LAB_0016dcb1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_158,&this->V);
  trim_trailing_zeroes = SUB81(pbVar9,0);
  local_108 = 1.0;
  dStack_100 = 0.0;
  local_1d0._0_1_ = bVar15;
LAB_0016dcb6:
  pbVar9 = local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar23 = (this->bbox).ury;
  local_1c8 = (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_158.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  auVar25._8_4_ =
       (int)((long)local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 0x25);
  auVar25._0_8_ = local_1c8;
  auVar25._12_4_ = 0x45300000;
  dVar23 = ((dVar23 - (this->bbox).lly) -
           ((auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_1c8) - 4503599627370496.0)) * local_138) * -0.5 +
           dVar23;
  bVar15 = local_1d0._0_1_ != '\0';
  local_1d0 = dVar23;
  if (bVar15) goto LAB_0016e383;
  QUtil::double_to_string_abi_cxx11_
            (&local_50,(QUtil *)0x0,(this->bbox).llx,1,(bool)trim_trailing_zeroes);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x262833);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_60 = *plVar12;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar12;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_e0 = *puVar11;
    lStack_d8 = plVar7[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar11;
    local_f0 = (ulong *)*plVar7;
  }
  local_e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_90,(QUtil *)0x0,((this->bbox).lly + local_1d0) - local_108 * local_138,1,
             SUB81(puVar11,0));
  uVar6 = 0xf;
  if (local_f0 != &local_e0) {
    uVar6 = local_e0;
  }
  if (uVar6 < local_90._M_string_length + local_e8) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar17 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_90._M_string_length + local_e8) goto LAB_0016dead;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0016dead:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90._M_dataplus._M_p);
  }
  local_128 = &local_118;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_118 = *plVar7;
    uStack_110 = puVar8[3];
  }
  else {
    local_118 = *plVar7;
    local_128 = (long *)*puVar8;
  }
  local_120 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_198.field_2._M_allocated_capacity = *puVar11;
    local_198.field_2._8_8_ = plVar7[3];
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar11;
    local_198._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_198._M_string_length = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_
            (&local_b0,(QUtil *)0x0,(this->bbox).urx - (this->bbox).llx,1,SUB81(puVar11,0));
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    uVar17 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_b0._M_string_length + local_198._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar17 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_b0._M_string_length + local_198._M_string_length) goto LAB_0016e005;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
  }
  else {
LAB_0016e005:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_b0._M_dataplus._M_p);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  puVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_178.field_2._M_allocated_capacity = *puVar11;
    local_178.field_2._8_8_ = puVar8[3];
  }
  else {
    local_178.field_2._M_allocated_capacity = *puVar11;
    local_178._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_178._M_string_length = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  paVar1 = &local_1c0.field_2;
  puVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_1c0.field_2._M_allocated_capacity = *puVar11;
    local_1c0.field_2._8_8_ = puVar8[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *puVar11;
    local_1c0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1c0._M_string_length = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  QUtil::double_to_string_abi_cxx11_(&local_d0,(QUtil *)0x0,local_138,1,SUB81(puVar11,0));
  uVar6 = (long)(_func_int ***)local_1c0._M_string_length + local_d0._M_string_length;
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    uVar17 = local_1c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < uVar6) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar17 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < uVar6) goto LAB_0016e144;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p);
  }
  else {
LAB_0016e144:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar22 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar22) {
    local_210.field_2._M_allocated_capacity = *psVar22;
    local_210.field_2._8_8_ = puVar8[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar22;
    local_210._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_210._M_string_length = puVar8[1];
  *puVar8 = psVar22;
  puVar8[1] = 0;
  *(undefined1 *)psVar22 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_1e0 = *plVar12;
    lStack_1d8 = plVar7[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar12;
    local_1f0 = (long *)*plVar7;
  }
  local_1e8 = (void *)plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  QPDFObjectHandle::TokenFilter::write
            (&local_1a0->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar12);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  this = local_1a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_0016e383:
  local_1d0 = local_1d0 - this->tf;
  std::operator+(&local_210,"q\nBT\n",&this->DA);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_1e0 = *plVar12;
    lStack_1d8 = plVar7[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar12;
    local_1f0 = (long *)*plVar7;
  }
  local_1e8 = (void *)plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  QPDFObjectHandle::TokenFilter::write
            (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar12);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (pbVar9 != pbVar2) {
    local_138 = -local_138;
    uStack_130 = uStack_130 ^ 0x8000000000000000;
    local_1c8 = local_1c8 + (local_1c8 == 0);
    lVar20 = 0;
    uVar6 = 0;
    do {
      if (uVar6 == 0) {
        QUtil::double_to_string_abi_cxx11_
                  (&local_178,(QUtil *)0x0,(this->bbox).llx + 1.0,1,SUB81(plVar12,0));
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_1c0.field_2._M_allocated_capacity = *puVar11;
          local_1c0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_1c0.field_2._M_allocated_capacity = *puVar11;
          local_1c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_1c0._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        QUtil::double_to_string_abi_cxx11_
                  (&local_198,(QUtil *)0x0,(this->bbox).lly + local_1d0,1,SUB81(puVar11,0));
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          uVar17 = local_1c0.field_2._M_allocated_capacity;
        }
        uVar10 = (long)(_func_int ***)local_1c0._M_string_length + local_198._M_string_length;
        if ((ulong)uVar17 < uVar10) {
          uVar17 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            uVar17 = local_198.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < uVar10) goto LAB_0016e6a6;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_198,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p);
        }
        else {
LAB_0016e6a6:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1c0,(ulong)local_198._M_dataplus._M_p);
        }
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        psVar22 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_210.field_2._M_allocated_capacity = *psVar22;
          local_210.field_2._8_8_ = puVar8[3];
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar22;
          local_210._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_210._M_string_length = puVar8[1];
        *puVar8 = psVar22;
        puVar8[1] = 0;
        *(undefined1 *)psVar22 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_1e0 = *plVar7;
          lStack_1d8 = puVar8[3];
          local_1f0 = &local_1e0;
        }
        else {
          local_1e0 = *plVar7;
          local_1f0 = (long *)*puVar8;
        }
        local_1e8 = (void *)puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar7);
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,local_1e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_178.field_2._M_allocated_capacity;
        _Var18._M_p = local_178._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_0016e7fe;
      }
      else {
        QUtil::double_to_string_abi_cxx11_(&local_1c0,(QUtil *)0x0,local_138,1,SUB81(plVar12,0));
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x26285c);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        psVar22 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar22) {
          local_210.field_2._M_allocated_capacity = *psVar22;
          local_210.field_2._8_8_ = puVar8[3];
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar22;
          local_210._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_210._M_string_length = puVar8[1];
        *puVar8 = psVar22;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_1e0 = *plVar7;
          lStack_1d8 = puVar8[3];
          local_1f0 = &local_1e0;
        }
        else {
          local_1e0 = *plVar7;
          local_1f0 = (long *)*puVar8;
        }
        local_1e8 = (void *)puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar7);
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,local_1e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_1c0.field_2._M_allocated_capacity;
        _Var18._M_p = local_1c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
LAB_0016e7fe:
          operator_delete(_Var18._M_p,uVar17 + 1);
        }
      }
      if ((ulong)((long)local_158.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_158.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      QPDFObjectHandle::newString
                ((QPDFObjectHandle *)&local_1c0,
                 (string *)
                 ((long)&((local_158.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar20));
      QPDFObjectHandle::unparse_abi_cxx11_(&local_210,(QPDFObjectHandle *)&local_1c0);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
      plVar12 = puVar8 + 2;
      if ((long *)*puVar8 == plVar12) {
        local_1e0 = *plVar12;
        lStack_1d8 = puVar8[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *plVar12;
        local_1f0 = (long *)*puVar8;
      }
      local_1e8 = (void *)puVar8[1];
      *puVar8 = plVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      QPDFObjectHandle::TokenFilter::write
                (&this->super_TokenFilter,(int)&local_1f0,local_1e8,(size_t)plVar12);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length);
      }
      uVar6 = uVar6 + 1;
      lVar20 = lVar20 + 0x20;
    } while (local_1c8 != uVar6);
  }
  local_1f0 = &local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ET\nQ\nEMC","");
  QPDFObjectHandle::TokenFilter::write
            (&this->super_TokenFilter,(int)&local_1f0,__buf,(size_t)plVar12);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return;
LAB_0016dad9:
  this = local_1a0;
  i = i + 1;
  psVar22 = psVar22 + 4;
  if (uVar14 == i) goto code_r0x0016dae5;
  goto LAB_0016dab4;
code_r0x0016dae5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_158,&local_1a0->V);
  trim_trailing_zeroes = (undefined1)uVar10;
  uVar14 = uVar6 - 1;
  if (local_1c8 < uVar6 - 1) {
    uVar14 = local_1c8;
  }
  local_108 = 1.0;
  dStack_100 = 0.0;
  if (uVar14 != 0) {
    lVar20 = 0;
    uVar6 = 0;
    do {
      pbVar2 = (local_1a0->opt).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_1a0->opt).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_158,(value_type *)((long)&(pbVar2->_M_dataplus)._M_p + lVar20));
      trim_trailing_zeroes = (undefined1)uVar10;
      uVar6 = uVar6 + 1;
      lVar20 = lVar20 + 0x20;
      this = local_1a0;
    } while (uVar14 != uVar6);
  }
LAB_0016dcb1:
  goto LAB_0016dcb6;
}

Assistant:

void
ValueSetter::writeAppearance()
{
    this->replaced = true;

    // This code does not take quadding into consideration because doing so requires font metric
    // information, which we don't have in many cases.

    double tfh = 1.2 * tf;
    int dx = 1;

    // Write one or more lines, centered vertically, possibly with one row highlighted.

    auto max_rows = static_cast<size_t>((bbox.ury - bbox.lly) / tfh);
    bool highlight = false;
    size_t highlight_idx = 0;

    std::vector<std::string> lines;
    if (opt.empty() || (max_rows < 2)) {
        lines.push_back(V);
    } else {
        // Figure out what rows to write
        size_t nopt = opt.size();
        size_t found_idx = 0;
        bool found = false;
        for (found_idx = 0; found_idx < nopt; ++found_idx) {
            if (opt.at(found_idx) == V) {
                found = true;
                break;
            }
        }
        if (found) {
            // Try to make the found item the second one, but adjust for under/overflow.
            int wanted_first = QIntC::to_int(found_idx) - 1;
            int wanted_last = QIntC::to_int(found_idx + max_rows) - 2;
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list found");
            if (wanted_first < 0) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list first too low");
                wanted_last -= wanted_first;
                wanted_first = 0;
            }
            if (wanted_last >= QIntC::to_int(nopt)) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper list last too high");
                auto diff = wanted_last - QIntC::to_int(nopt) + 1;
                wanted_first = std::max(0, wanted_first - diff);
                wanted_last -= diff;
            }
            highlight = true;
            highlight_idx = found_idx - QIntC::to_size(wanted_first);
            for (size_t i = QIntC::to_size(wanted_first); i <= QIntC::to_size(wanted_last); ++i) {
                lines.push_back(opt.at(i));
            }
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper list not found");
            // include our value and the first n-1 rows
            highlight_idx = 0;
            highlight = true;
            lines.push_back(V);
            for (size_t i = 0; ((i < nopt) && (i < (max_rows - 1))); ++i) {
                lines.push_back(opt.at(i));
            }
        }
    }

    // Write the lines centered vertically, highlighting if needed
    size_t nlines = lines.size();
    double dy = bbox.ury - ((bbox.ury - bbox.lly - (static_cast<double>(nlines) * tfh)) / 2.0);
    if (highlight) {
        write(
            "q\n0.85 0.85 0.85 rg\n" + QUtil::double_to_string(bbox.llx) + " " +
            QUtil::double_to_string(
                bbox.lly + dy - (tfh * (static_cast<double>(highlight_idx + 1)))) +
            " " + QUtil::double_to_string(bbox.urx - bbox.llx) + " " +
            QUtil::double_to_string(tfh) + " re f\nQ\n");
    }
    dy -= tf;
    write("q\nBT\n" + DA + "\n");
    for (size_t i = 0; i < nlines; ++i) {
        // We could adjust Tm to translate to the beginning the first line, set TL to tfh, and use
        // T* for each subsequent line, but doing this would require extracting any Tm from DA,
        // which doesn't seem really worth the effort.
        if (i == 0) {
            write(
                QUtil::double_to_string(bbox.llx + static_cast<double>(dx)) + " " +
                QUtil::double_to_string(bbox.lly + static_cast<double>(dy)) + " Td\n");
        } else {
            write("0 " + QUtil::double_to_string(-tfh) + " Td\n");
        }
        write(QPDFObjectHandle::newString(lines.at(i)).unparse() + " Tj\n");
    }
    write("ET\nQ\nEMC");
}